

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deblock.c
# Opt level: O1

void com_deblock_lcu_row(com_core_t *core,int lcu_y)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  com_seqh_t *pcVar9;
  com_pic_header_t *pcVar10;
  com_pic_t *pcVar11;
  s8 *psVar12;
  ulong uVar13;
  byte bVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  char *pcVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  ushort *puVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  ulong uVar28;
  uint uVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  uint uVar34;
  uint uVar35;
  char *pcVar36;
  int iVar37;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  pel *local_90;
  pel *local_80;
  
  pcVar9 = core->seqhdr;
  pcVar10 = core->pichdr;
  iVar3 = pcVar9->pic_width_in_lcu;
  bVar14 = (char)pcVar9->bit_depth_internal - 8;
  iVar4 = pcVar10->fixed_picture_qp_flag;
  uVar20 = pcVar9->max_cuwh * lcu_y;
  iVar26 = pcVar9->max_cuwh + uVar20;
  if (pcVar9->pic_height <= iVar26) {
    iVar26 = pcVar9->pic_height;
  }
  iVar5 = pcVar9->bit_depth_2_qp_offset;
  if (iVar4 != 0) {
    iVar23 = (core->map).map_qp[lcu_y * iVar3] - iVar5;
    iVar30 = iVar23 * 2 >> 1;
    iVar6 = pcVar10->alpha_c_offset;
    iVar7 = pcVar10->beta_offset;
    iVar33 = iVar30 + iVar6;
    iVar37 = 0x3f;
    if (iVar33 < 0x40) {
      iVar37 = iVar33;
    }
    if (iVar33 < 0) {
      iVar37 = 0;
    }
    local_b8 = (uint)""[iVar37] << (bVar14 & 0x1f);
    iVar30 = iVar30 + iVar7;
    iVar37 = 0x3f;
    if (iVar30 < 0x40) {
      iVar37 = iVar30;
    }
    if (iVar30 < 0) {
      iVar37 = 0;
    }
    local_bc = (uint)""[iVar37] << (bVar14 & 0x1f);
    uVar29 = pcVar10->chroma_quant_param_delta_cb + iVar23;
    uVar15 = uVar29;
    if (-1 < (int)uVar29) {
      uVar21 = 0x3f;
      if ((int)uVar29 < 0x3f) {
        uVar21 = (ulong)uVar29;
      }
      uVar15 = (uint)""[uVar21];
    }
    uVar34 = uVar29;
    if (-1 < (int)uVar29) {
      uVar21 = 0x3f;
      if ((int)uVar29 < 0x3f) {
        uVar21 = (ulong)uVar29;
      }
      uVar34 = (uint)""[uVar21];
    }
    iVar37 = uVar15 + iVar5;
    if ((int)(uVar15 + iVar5) < 1) {
      iVar37 = 0;
    }
    iVar25 = uVar34 + iVar5;
    if ((int)(uVar34 + iVar5) < 1) {
      iVar25 = 0;
    }
    iVar37 = (iVar37 + iVar25 + 1U >> 1) - iVar5;
    uVar15 = iVar37 + iVar6;
    if (0x3e < (int)uVar15) {
      uVar15 = 0x3f;
    }
    uVar21 = (ulong)uVar15;
    if ((int)uVar15 < 1) {
      uVar21 = 0;
    }
    local_d0 = (uint)""[uVar21] << (bVar14 & 0x1f);
    uVar15 = iVar37 + iVar7;
    if (0x3e < (int)uVar15) {
      uVar15 = 0x3f;
    }
    uVar21 = (ulong)uVar15;
    if ((int)uVar15 < 1) {
      uVar21 = 0;
    }
    local_d4 = (uint)""[uVar21] << (bVar14 & 0x1f);
    uVar34 = iVar23 + pcVar10->chroma_quant_param_delta_cr;
    uVar15 = uVar34;
    if (-1 < (int)uVar34) {
      uVar21 = 0x3f;
      if ((int)uVar34 < 0x3f) {
        uVar21 = (ulong)uVar34;
      }
      uVar15 = (uint)""[uVar21];
    }
    uVar35 = uVar34;
    if (-1 < (int)uVar34) {
      uVar21 = 0x3f;
      if ((int)uVar34 < 0x3f) {
        uVar21 = (ulong)uVar34;
      }
      uVar35 = (uint)""[uVar21];
    }
    iVar23 = 0;
    iVar37 = uVar15 + iVar5;
    if ((int)(uVar15 + iVar5) < 1) {
      iVar37 = iVar23;
    }
    iVar25 = uVar35 + iVar5;
    if ((int)(uVar35 + iVar5) < 1) {
      iVar25 = iVar23;
    }
    iVar37 = (iVar37 + iVar25 + 1U >> 1) - iVar5;
    uVar15 = iVar37 + iVar6;
    if (0x3e < (int)uVar15) {
      uVar15 = 0x3f;
    }
    uVar21 = (ulong)uVar15;
    if ((int)uVar15 < 1) {
      uVar21 = 0;
    }
    local_e0 = (uint)""[uVar21] << (bVar14 & 0x1f);
    uVar15 = iVar37 + iVar7;
    if (0x3e < (int)uVar15) {
      uVar15 = 0x3f;
    }
    uVar21 = (ulong)uVar15;
    if ((int)uVar15 < 1) {
      uVar21 = 0;
    }
    local_dc = (uint)""[uVar21] << (bVar14 & 0x1f);
    iVar37 = 0x3f;
    if (iVar33 < 0x40) {
      iVar37 = iVar33;
    }
    if (iVar33 < 0) {
      iVar37 = iVar23;
    }
    local_d8 = (uint)""[iVar37] << (bVar14 & 0x1f);
    iVar33 = 0x3f;
    if (iVar30 < 0x40) {
      iVar33 = iVar30;
    }
    if (iVar30 < 0) {
      iVar33 = 0;
    }
    local_b4 = (uint)""[iVar33] << (bVar14 & 0x1f);
    uVar15 = uVar29;
    if (-1 < (int)uVar29) {
      uVar21 = 0x3f;
      if ((int)uVar29 < 0x3f) {
        uVar21 = (ulong)uVar29;
      }
      uVar15 = (uint)""[uVar21];
    }
    if (-1 < (int)uVar29) {
      uVar21 = 0x3f;
      if ((int)uVar29 < 0x3f) {
        uVar21 = (ulong)uVar29;
      }
      uVar29 = (uint)""[uVar21];
    }
    iVar33 = uVar15 + iVar5;
    if ((int)(uVar15 + iVar5) < 1) {
      iVar33 = 0;
    }
    iVar37 = uVar29 + iVar5;
    if ((int)(uVar29 + iVar5) < 1) {
      iVar37 = 0;
    }
    iVar33 = (iVar33 + iVar37 + 1U >> 1) - iVar5;
    uVar15 = iVar33 + iVar6;
    if (0x3e < (int)uVar15) {
      uVar15 = 0x3f;
    }
    uVar21 = (ulong)uVar15;
    if ((int)uVar15 < 1) {
      uVar21 = 0;
    }
    local_c0 = (uint)""[uVar21] << (bVar14 & 0x1f);
    uVar15 = iVar33 + iVar7;
    if (0x3e < (int)uVar15) {
      uVar15 = 0x3f;
    }
    uVar21 = (ulong)uVar15;
    if ((int)uVar15 < 1) {
      uVar21 = 0;
    }
    local_c4 = (uint)""[uVar21] << (bVar14 & 0x1f);
    uVar15 = uVar34;
    if (-1 < (int)uVar34) {
      uVar21 = 0x3f;
      if ((int)uVar34 < 0x3f) {
        uVar21 = (ulong)uVar34;
      }
      uVar15 = (uint)""[uVar21];
    }
    if (-1 < (int)uVar34) {
      uVar21 = 0x3f;
      if ((int)uVar34 < 0x3f) {
        uVar21 = (ulong)uVar34;
      }
      uVar34 = (uint)""[uVar21];
    }
    iVar33 = uVar15 + iVar5;
    if ((int)(uVar15 + iVar5) < 1) {
      iVar33 = 0;
    }
    iVar37 = uVar34 + iVar5;
    if ((int)(uVar34 + iVar5) < 1) {
      iVar37 = 0;
    }
    iVar33 = (iVar37 + iVar33 + 1U >> 1) - iVar5;
    uVar15 = iVar6 + iVar33;
    if (0x3e < (int)uVar15) {
      uVar15 = 0x3f;
    }
    uVar21 = (ulong)uVar15;
    if ((int)uVar15 < 1) {
      uVar21 = 0;
    }
    local_c8 = (uint)""[uVar21] << (bVar14 & 0x1f);
    uVar15 = iVar33 + iVar7;
    if (0x3e < (int)uVar15) {
      uVar15 = 0x3f;
    }
    uVar21 = (ulong)uVar15;
    if ((int)uVar15 < 1) {
      uVar21 = 0;
    }
    local_cc = (uint)""[uVar21] << (bVar14 & 0x1f);
  }
  if ((int)uVar20 < iVar26) {
    pcVar11 = core->pic;
    iVar33 = pcVar11->stride_luma;
    iVar6 = pcVar11->stride_chroma;
    local_80 = pcVar11->y + (long)(int)uVar20 * (long)iVar33;
    iVar7 = pcVar9->i_scu;
    local_90 = pcVar11->uv + (long)((int)uVar20 >> 1) * (long)iVar6;
    iVar37 = iVar5 * -2 + 1;
    do {
      psVar12 = (core->map).map_qp;
      bVar1 = (byte)pcVar9->log2_max_cuwh;
      pcVar36 = psVar12 + ((int)uVar20 >> (bVar1 & 0x1f)) * iVar3;
      pcVar18 = psVar12 + ((int)(uVar20 - 8) >> (bVar1 & 0x1f)) * iVar3;
      if (iVar4 == 0) {
        iVar23 = (int)*pcVar36;
        if (uVar20 != 0) {
          iVar31 = (int)*pcVar18;
          iVar27 = iVar37 + iVar23 + iVar31 >> 1;
          iVar30 = pcVar10->alpha_c_offset;
          iVar25 = pcVar10->beta_offset;
          uVar15 = iVar27 + iVar30;
          if (0x3e < (int)uVar15) {
            uVar15 = 0x3f;
          }
          uVar21 = (ulong)uVar15;
          if ((int)uVar15 < 1) {
            uVar21 = 0;
          }
          local_b8 = (uint)""[uVar21] << (bVar14 & 0x1f);
          uVar15 = iVar27 + iVar25;
          if (0x3e < (int)uVar15) {
            uVar15 = 0x3f;
          }
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          local_bc = (uint)""[uVar15] << (bVar14 & 0x1f);
          uVar15 = (iVar23 - iVar5) + (int)pcVar10->chroma_quant_param_delta_cb;
          if (-1 < (int)uVar15) {
            uVar21 = (ulong)uVar15;
            if (0x3e < (int)uVar15) {
              uVar21 = 0x3f;
            }
            uVar15 = (uint)""[uVar21];
          }
          iVar31 = iVar31 - iVar5;
          uVar29 = pcVar10->chroma_quant_param_delta_cb + iVar31;
          if (-1 < (int)uVar29) {
            uVar21 = (ulong)uVar29;
            if (0x3e < (int)uVar29) {
              uVar21 = 0x3f;
            }
            uVar29 = (uint)""[uVar21];
          }
          iVar27 = uVar15 + iVar5;
          if ((int)(uVar15 + iVar5) < 1) {
            iVar27 = 0;
          }
          iVar16 = uVar29 + iVar5;
          if (iVar16 < 1) {
            iVar16 = 0;
          }
          iVar27 = (iVar27 + iVar16 + 1U >> 1) - iVar5;
          uVar15 = iVar27 + iVar30;
          if (0x3e < (int)uVar15) {
            uVar15 = 0x3f;
          }
          uVar21 = (ulong)uVar15;
          if ((int)uVar15 < 1) {
            uVar21 = 0;
          }
          local_d0 = (uint)""[uVar21] << (bVar14 & 0x1f);
          uVar15 = iVar27 + iVar25;
          if (0x3e < (int)uVar15) {
            uVar15 = 0x3f;
          }
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          local_d4 = (uint)""[uVar15] << (bVar14 & 0x1f);
          uVar15 = (iVar23 - iVar5) + (int)pcVar10->chroma_quant_param_delta_cr;
          if (-1 < (int)uVar15) {
            if (0x3e < (int)uVar15) {
              uVar15 = 0x3f;
            }
            uVar15 = (uint)""[uVar15];
          }
          uVar29 = iVar31 + pcVar10->chroma_quant_param_delta_cr;
          if (-1 < (int)uVar29) {
            uVar21 = (ulong)uVar29;
            if (0x3e < (int)uVar29) {
              uVar21 = 0x3f;
            }
            uVar29 = (uint)""[uVar21];
          }
          iVar27 = uVar15 + iVar5;
          if (iVar27 < 1) {
            iVar27 = 0;
          }
          iVar31 = uVar29 + iVar5;
          if (iVar31 < 1) {
            iVar31 = 0;
          }
          iVar27 = (iVar27 + iVar31 + 1U >> 1) - iVar5;
          uVar15 = iVar30 + iVar27;
          if (0x3e < (int)uVar15) {
            uVar15 = 0x3f;
          }
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          local_e0 = (uint)""[uVar15] << (bVar14 & 0x1f);
          uVar15 = iVar27 + iVar25;
          if (0x3e < (int)uVar15) {
            uVar15 = 0x3f;
          }
          uVar21 = (ulong)uVar15;
          if ((int)uVar15 < 1) {
            uVar21 = 0;
          }
          local_dc = (uint)""[uVar21] << (bVar14 & 0x1f);
        }
        iVar23 = iVar23 - iVar5;
        iVar27 = iVar23 * 2 >> 1;
        iVar30 = pcVar10->alpha_c_offset;
        iVar25 = pcVar10->beta_offset;
        uVar15 = iVar30 + iVar27;
        if (0x3e < (int)uVar15) {
          uVar15 = 0x3f;
        }
        uVar21 = (ulong)uVar15;
        if ((int)uVar15 < 1) {
          uVar21 = 0;
        }
        local_d8 = (uint)""[uVar21] << (bVar14 & 0x1f);
        uVar15 = iVar27 + iVar25;
        if (0x3e < (int)uVar15) {
          uVar15 = 0x3f;
        }
        uVar21 = (ulong)uVar15;
        if ((int)uVar15 < 1) {
          uVar21 = 0;
        }
        local_b4 = (uint)""[uVar21] << (bVar14 & 0x1f);
        uVar29 = pcVar10->chroma_quant_param_delta_cb + iVar23;
        uVar15 = uVar29;
        if (-1 < (int)uVar29) {
          uVar21 = 0x3f;
          if ((int)uVar29 < 0x3f) {
            uVar21 = (ulong)uVar29;
          }
          uVar15 = (uint)""[uVar21];
        }
        if (-1 < (int)uVar29) {
          uVar21 = (ulong)uVar29;
          if (0x3e < (int)uVar29) {
            uVar21 = 0x3f;
          }
          uVar29 = (uint)""[uVar21];
        }
        iVar27 = uVar15 + iVar5;
        if (iVar27 < 1) {
          iVar27 = 0;
        }
        iVar31 = uVar29 + iVar5;
        if (iVar31 < 1) {
          iVar31 = 0;
        }
        iVar27 = (iVar27 + iVar31 + 1U >> 1) - iVar5;
        uVar15 = iVar27 + iVar30;
        if (0x3e < (int)uVar15) {
          uVar15 = 0x3f;
        }
        uVar21 = (ulong)uVar15;
        if ((int)uVar15 < 1) {
          uVar21 = 0;
        }
        local_c0 = (uint)""[uVar21] << (bVar14 & 0x1f);
        uVar15 = iVar27 + iVar25;
        if (0x3e < (int)uVar15) {
          uVar15 = 0x3f;
        }
        if ((int)uVar15 < 1) {
          uVar15 = 0;
        }
        local_c4 = (uint)""[uVar15] << (bVar14 & 0x1f);
        uVar29 = iVar23 + pcVar10->chroma_quant_param_delta_cr;
        uVar15 = uVar29;
        if (-1 < (int)uVar29) {
          uVar21 = 0x3f;
          if ((int)uVar29 < 0x3f) {
            uVar21 = (ulong)uVar29;
          }
          uVar15 = (uint)""[uVar21];
        }
        if (-1 < (int)uVar29) {
          uVar21 = (ulong)uVar29;
          if (0x3e < (int)uVar29) {
            uVar21 = 0x3f;
          }
          uVar29 = (uint)""[uVar21];
        }
        iVar23 = uVar15 + iVar5;
        if (iVar23 < 1) {
          iVar23 = 0;
        }
        iVar27 = uVar29 + iVar5;
        if (iVar27 < 1) {
          iVar27 = 0;
        }
        iVar23 = (iVar27 + iVar23 + 1U >> 1) - iVar5;
        uVar15 = iVar30 + iVar23;
        if (0x3e < (int)uVar15) {
          uVar15 = 0x3f;
        }
        uVar21 = (ulong)uVar15;
        if ((int)uVar15 < 1) {
          uVar21 = 0;
        }
        local_c8 = (uint)""[uVar21] << (bVar14 & 0x1f);
        uVar15 = iVar23 + iVar25;
        if (0x3e < (int)uVar15) {
          uVar15 = 0x3f;
        }
        if ((int)uVar15 < 1) {
          uVar15 = 0;
        }
        local_cc = (uint)""[uVar15] << (bVar14 & 0x1f);
      }
      iVar23 = pcVar9->pic_width;
      if (0 < iVar23) {
        puVar22 = (ushort *)((core->map).map_edge + ((int)uVar20 >> 2) * iVar7);
        uVar21 = 0;
        do {
          if (iVar4 == 0) {
            iVar31 = (int)uVar21;
            uVar28 = (uVar21 & 0xffffffff) >> ((byte)pcVar9->log2_max_cuwh & 0x3f);
            iVar27 = (int)pcVar36[uVar28];
            iVar30 = pcVar9->max_cuwh;
            iVar25 = (int)((long)((ulong)(uint)(iVar31 >> 0x1f) << 0x20 | uVar21 & 0xffffffff) %
                          (long)iVar30);
            if (((uVar21 != 0) && (uVar20 != 0)) && (iVar25 == 0)) {
              iVar32 = (int)pcVar18[uVar28];
              iVar24 = iVar37 + iVar27 + iVar32 >> 1;
              iVar16 = pcVar10->alpha_c_offset;
              uVar15 = iVar24 + iVar16;
              if (0x3e < (int)uVar15) {
                uVar15 = 0x3f;
              }
              uVar19 = (ulong)uVar15;
              if ((int)uVar15 < 1) {
                uVar19 = 0;
              }
              local_b8 = (uint)""[uVar19] << (bVar14 & 0x1f);
              iVar8 = pcVar10->beta_offset;
              uVar15 = iVar24 + iVar8;
              if (0x3e < (int)uVar15) {
                uVar15 = 0x3f;
              }
              if ((int)uVar15 < 1) {
                uVar15 = 0;
              }
              local_bc = (uint)""[uVar15] << (bVar14 & 0x1f);
              uVar15 = (iVar27 - iVar5) + (int)pcVar10->chroma_quant_param_delta_cb;
              if (-1 < (int)uVar15) {
                if (0x3e < (int)uVar15) {
                  uVar15 = 0x3f;
                }
                uVar15 = (uint)""[uVar15];
              }
              iVar32 = iVar32 - iVar5;
              uVar29 = pcVar10->chroma_quant_param_delta_cb + iVar32;
              if (-1 < (int)uVar29) {
                uVar19 = (ulong)uVar29;
                if (0x3e < (int)uVar29) {
                  uVar19 = 0x3f;
                }
                uVar29 = (uint)""[uVar19];
              }
              iVar24 = uVar15 + iVar5;
              uVar19 = 0;
              if (iVar24 < 1) {
                iVar24 = 0;
              }
              iVar17 = uVar29 + iVar5;
              if (iVar17 < 1) {
                iVar17 = 0;
              }
              iVar24 = (iVar24 + iVar17 + 1U >> 1) - iVar5;
              uVar15 = iVar24 + iVar16;
              if (0x3e < (int)uVar15) {
                uVar15 = 0x3f;
              }
              uVar13 = (ulong)uVar15;
              if ((int)uVar15 < 1) {
                uVar13 = uVar19;
              }
              local_d0 = (uint)""[uVar13] << (bVar14 & 0x1f);
              uVar15 = iVar24 + iVar8;
              if (0x3e < (int)uVar15) {
                uVar15 = 0x3f;
              }
              if (0 < (int)uVar15) {
                uVar19 = (ulong)uVar15;
              }
              local_d4 = (uint)""[uVar19] << (bVar14 & 0x1f);
              uVar15 = (iVar27 - iVar5) + (int)pcVar10->chroma_quant_param_delta_cr;
              if (-1 < (int)uVar15) {
                if (0x3e < (int)uVar15) {
                  uVar15 = 0x3f;
                }
                uVar15 = (uint)""[uVar15];
              }
              uVar29 = iVar32 + pcVar10->chroma_quant_param_delta_cr;
              if (-1 < (int)uVar29) {
                if (0x3e < (int)uVar29) {
                  uVar29 = 0x3f;
                }
                uVar29 = (uint)""[uVar29];
              }
              iVar24 = uVar15 + iVar5;
              uVar19 = 0;
              if (iVar24 < 1) {
                iVar24 = 0;
              }
              iVar32 = uVar29 + iVar5;
              if (iVar32 < 1) {
                iVar32 = 0;
              }
              iVar24 = (iVar24 + iVar32 + 1U >> 1) - iVar5;
              uVar15 = iVar16 + iVar24;
              if (0x3e < (int)uVar15) {
                uVar15 = 0x3f;
              }
              uVar13 = (ulong)uVar15;
              if ((int)uVar15 < 1) {
                uVar13 = uVar19;
              }
              local_e0 = (uint)""[uVar13] << (bVar14 & 0x1f);
              uVar15 = iVar24 + iVar8;
              if (0x3e < (int)uVar15) {
                uVar15 = 0x3f;
              }
              if (0 < (int)uVar15) {
                uVar19 = (ulong)uVar15;
              }
              local_dc = (uint)""[uVar19] << (bVar14 & 0x1f);
            }
            if ((uVar21 != 0 && iVar25 == 0) ||
               ((iVar31 + 8 < iVar23 && ((iVar31 + 8) % iVar30 == 0)))) {
              iVar25 = iVar37 + iVar27 + (int)pcVar36[((iVar31 + 8) % iVar30 == 0) + uVar28] >> 1;
              iVar23 = pcVar10->alpha_c_offset;
              uVar15 = iVar25 + iVar23;
              if (0x3e < (int)uVar15) {
                uVar15 = 0x3f;
              }
              uVar19 = (ulong)uVar15;
              if ((int)uVar15 < 1) {
                uVar19 = 0;
              }
              local_d8 = (uint)""[uVar19] << (bVar14 & 0x1f);
              iVar16 = pcVar10->beta_offset;
              uVar15 = iVar25 + iVar16;
              if (0x3e < (int)uVar15) {
                uVar15 = 0x3f;
              }
              uVar19 = (ulong)uVar15;
              if ((int)uVar15 < 1) {
                uVar19 = 0;
              }
              local_b4 = (uint)""[uVar19] << (bVar14 & 0x1f);
              uVar15 = (iVar27 - iVar5) + (int)pcVar10->chroma_quant_param_delta_cb;
              if (-1 < (int)uVar15) {
                uVar19 = (ulong)uVar15;
                if (0x3e < (int)uVar15) {
                  uVar19 = 0x3f;
                }
                uVar15 = (uint)""[uVar19];
              }
              iVar30 = pcVar36[((iVar31 + 8) % iVar30 == 0) + uVar28] - iVar5;
              uVar29 = pcVar10->chroma_quant_param_delta_cb + iVar30;
              if (-1 < (int)uVar29) {
                if (0x3e < (int)uVar29) {
                  uVar29 = 0x3f;
                }
                uVar29 = (uint)""[uVar29];
              }
              iVar25 = uVar15 + iVar5;
              if (iVar25 < 1) {
                iVar25 = 0;
              }
              iVar31 = uVar29 + iVar5;
              if (iVar31 < 1) {
                iVar31 = 0;
              }
              iVar25 = (iVar25 + iVar31 + 1U >> 1) - iVar5;
              uVar15 = iVar25 + iVar23;
              if (0x3e < (int)uVar15) {
                uVar15 = 0x3f;
              }
              if ((int)uVar15 < 1) {
                uVar15 = 0;
              }
              local_c0 = (uint)""[uVar15] << (bVar14 & 0x1f);
              uVar15 = iVar25 + iVar16;
              if (0x3e < (int)uVar15) {
                uVar15 = 0x3f;
              }
              uVar28 = 0;
              if (0 < (int)uVar15) {
                uVar28 = (ulong)uVar15;
              }
              local_c4 = (uint)""[uVar28] << (bVar14 & 0x1f);
              uVar15 = (iVar27 - iVar5) + (int)pcVar10->chroma_quant_param_delta_cr;
              if (-1 < (int)uVar15) {
                uVar28 = (ulong)uVar15;
                if (0x3e < (int)uVar15) {
                  uVar28 = 0x3f;
                }
                uVar15 = (uint)""[uVar28];
              }
              uVar29 = iVar30 + pcVar10->chroma_quant_param_delta_cr;
              if (-1 < (int)uVar29) {
                uVar28 = (ulong)uVar29;
                if (0x3e < (int)uVar29) {
                  uVar28 = 0x3f;
                }
                uVar29 = (uint)""[uVar28];
              }
              iVar30 = uVar15 + iVar5;
              uVar28 = 0;
              if (iVar30 < 1) {
                iVar30 = 0;
              }
              iVar25 = uVar29 + iVar5;
              if (iVar25 < 1) {
                iVar25 = 0;
              }
              iVar30 = (iVar25 + iVar30 + 1U >> 1) - iVar5;
              uVar15 = iVar23 + iVar30;
              if (0x3e < (int)uVar15) {
                uVar15 = 0x3f;
              }
              uVar19 = (ulong)uVar15;
              if ((int)uVar15 < 1) {
                uVar19 = uVar28;
              }
              local_c8 = (uint)""[uVar19] << (bVar14 & 0x1f);
              uVar15 = iVar30 + iVar16;
              if (0x3e < (int)uVar15) {
                uVar15 = 0x3f;
              }
              if (0 < (int)uVar15) {
                uVar28 = (ulong)uVar15;
              }
              local_cc = (uint)""[uVar28] << (bVar14 & 0x1f);
            }
          }
          uVar2 = CONCAT11(*(undefined1 *)((long)puVar22 + (long)(iVar7 + 2)),(char)puVar22[1]);
          uVar15 = (uint)uVar2 & 0x303;
          if ((((uVar2 & 0x303) != 0) &&
              ((*uavs3d_funs_handle.deblock_luma[0])
                         (local_80 + uVar21 + 8,iVar33,local_d8,local_b4,uVar15), (uVar21 & 8) != 0)
              ) && ((uVar2 & 0x202) != 0)) {
            (*uavs3d_funs_handle.deblock_chroma[0])
                      (local_90 + uVar21 + 8,iVar6,local_c0,local_c4,local_c8,local_cc,uVar15);
          }
          uVar2 = *puVar22;
          if ((((uVar2 >> 2 & 0x303) != 0) &&
              ((*uavs3d_funs_handle.deblock_luma[1])(local_80 + uVar21,iVar33,local_b8,local_bc,0),
              (uVar20 & 0xf) == 0)) && ((uVar2 >> 2 & 0x202) != 0)) {
            (*uavs3d_funs_handle.deblock_chroma[1])
                      (local_90 + uVar21,iVar6,local_d0,local_d4,local_e0,local_dc,0);
          }
          uVar21 = uVar21 + 8;
          puVar22 = puVar22 + 1;
          iVar23 = pcVar9->pic_width;
        } while ((int)uVar21 < iVar23);
      }
      local_80 = local_80 + (long)iVar33 * 8;
      local_90 = local_90 + (long)iVar6 * 4;
      uVar20 = uVar20 + 8;
    } while ((int)uVar20 < iVar26);
  }
  return;
}

Assistant:

void com_deblock_lcu_row(com_core_t *core, int lcu_y)
{
    com_seqh_t *seqhdr =  core->seqhdr;
    com_pic_header_t *pichdr =  core->pichdr;
    com_map_t *map   = &core->map;
    com_pic_t * pic  =  core->pic;
    int pix_y, pix_x;
    int i_lcu = seqhdr->pic_width_in_lcu;
    int i_scu = seqhdr->i_scu;
    int s_l = pic->stride_luma;
    int s_c = pic->stride_chroma;
    int shift = seqhdr->bit_depth_internal - 8;
    int alpha_hor_y, beta_hor_y, alpha_ver_y, beta_ver_y;
    int alpha_hor_u, beta_hor_u, alpha_ver_u, beta_ver_u;
    int alpha_hor_v, beta_hor_v, alpha_ver_v, beta_ver_v;
    int fix_qp = pichdr->fixed_picture_qp_flag;
    int pix_start_y = lcu_y * seqhdr->max_cuwh;
    int pix_end_y = COM_MIN(pix_start_y + seqhdr->max_cuwh, seqhdr->pic_height);
    pel *src_l = pic->y + pix_start_y * s_l;
    pel *src_uv = pic->uv + (pix_start_y >> 1) * s_c;
    int qp_offset = seqhdr->bit_depth_2_qp_offset;

    if (fix_qp) {
        int qp = map->map_qp[lcu_y * i_lcu];
        com_df_cal_y_param(pichdr, qp, qp, qp_offset, shift, &alpha_hor_y, &beta_hor_y);
        com_df_cal_c_param(pichdr, qp, qp, qp_offset, shift, &alpha_hor_u, &beta_hor_u, pichdr->chroma_quant_param_delta_cb);
        com_df_cal_c_param(pichdr, qp, qp, qp_offset, shift, &alpha_hor_v, &beta_hor_v, pichdr->chroma_quant_param_delta_cr);
        com_df_cal_y_param(pichdr, qp, qp, qp_offset, shift, &alpha_ver_y, &beta_ver_y);
        com_df_cal_c_param(pichdr, qp, qp, qp_offset, shift, &alpha_ver_u, &beta_ver_u, pichdr->chroma_quant_param_delta_cb);
        com_df_cal_c_param(pichdr, qp, qp, qp_offset, shift, &alpha_ver_v, &beta_ver_v, pichdr->chroma_quant_param_delta_cr);
    }

    for (pix_y = pix_start_y; pix_y < pix_end_y; pix_y += LOOPFILTER_GRID) {
        u8 *edge_flag = map->map_edge + (pix_y >> MIN_CU_LOG2) * i_scu;
        s8 *map_cur = map->map_qp + (pix_y >> seqhdr->log2_max_cuwh) * i_lcu;
        s8 *map_top = map->map_qp + ((pix_y - LOOPFILTER_GRID) >> seqhdr->log2_max_cuwh) * i_lcu;

        if (!fix_qp) {
            int qp_p = map_cur[0];
            if (pix_y) {
                int qp_q = map_top[0];
                com_df_cal_y_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_hor_y, &beta_hor_y);
                com_df_cal_c_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_hor_u, &beta_hor_u, pichdr->chroma_quant_param_delta_cb);
                com_df_cal_c_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_hor_v, &beta_hor_v, pichdr->chroma_quant_param_delta_cr);
            }
            {
                int qp_q = qp_p;
                com_df_cal_y_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_ver_y, &beta_ver_y);
                com_df_cal_c_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_ver_u, &beta_ver_u, pichdr->chroma_quant_param_delta_cb);
                com_df_cal_c_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_ver_v, &beta_ver_v, pichdr->chroma_quant_param_delta_cr);
            }
        }
        for (pix_x = 0; pix_x < seqhdr->pic_width; pix_x += LOOPFILTER_GRID) {
            int pix_x_ver = pix_x + LOOPFILTER_GRID;

            if (!fix_qp) {
                s8 *map_qp = map_cur + (pix_x >> seqhdr->log2_max_cuwh);
                int qp_p = map_qp[0];

                if (pix_x % seqhdr->max_cuwh == 0 && pix_x && pix_y) {
                    int qp_q = map_top[pix_x >> seqhdr->log2_max_cuwh];
                    com_df_cal_y_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_hor_y, &beta_hor_y);
                    com_df_cal_c_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_hor_u, &beta_hor_u, pichdr->chroma_quant_param_delta_cb);
                    com_df_cal_c_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_hor_v, &beta_hor_v, pichdr->chroma_quant_param_delta_cr);
                } 
                if ((pix_x % seqhdr->max_cuwh == 0 && pix_x) || (pix_x_ver % seqhdr->max_cuwh == 0 && pix_x_ver < seqhdr->pic_width)) {
                    int qp_q;
                    if (pix_x_ver % seqhdr->max_cuwh == 0) {
                        qp_q = map_qp[1];
                    } else {
                        qp_q = map_qp[0];
                    }
                    com_df_cal_y_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_ver_y, &beta_ver_y);
                    com_df_cal_c_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_ver_u, &beta_ver_u, pichdr->chroma_quant_param_delta_cb);
                    com_df_cal_c_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_ver_v, &beta_ver_v, pichdr->chroma_quant_param_delta_cr);
                }
            }

            int edge = ((edge_flag[2]) | ((edge_flag[2 + i_scu]) << 8)) & 0x0303;

            if (edge) {
                uavs3d_funs_handle.deblock_luma[0](src_l + pix_x_ver, s_l, alpha_ver_y, beta_ver_y, edge);

                if (pix_x_ver % LOOPFILTER_GRID_C == 0 && (edge & 0x0202)) {
                    uavs3d_funs_handle.deblock_chroma[0](src_uv + pix_x_ver, s_c, alpha_ver_u, beta_ver_u, alpha_ver_v, beta_ver_v, edge);
                }
            }
            
            edge = (M16(edge_flag) >> 2) & 0x0303;

            if (edge) {
                uavs3d_funs_handle.deblock_luma[1](src_l + pix_x, s_l, alpha_hor_y, beta_hor_y, edge);

                if (pix_y % LOOPFILTER_GRID_C == 0 && (edge & 0x0202)) {
                    uavs3d_funs_handle.deblock_chroma[1](src_uv + pix_x, s_c, alpha_hor_u, beta_hor_u, alpha_hor_v, beta_hor_v, edge);
                }
            }
            
            edge_flag += 2;
        }

        src_l  += s_l *  LOOPFILTER_GRID;
        src_uv += s_c * (LOOPFILTER_GRID / 2);
    }
}